

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::~SparseArray(SparseArray<re2::NFA::Thread_*> *this)

{
  SparseArray<re2::NFA::Thread_*> *in_RDI;
  
  DebugCheckInvariants(in_RDI);
  PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>::~PODArray
            ((PODArray<re2::SparseArray<re2::NFA::Thread_*>::IndexValue> *)0x255918);
  PODArray<int>::~PODArray((PODArray<int> *)0x255926);
  return;
}

Assistant:

SparseArray<Value>::~SparseArray() {
  DebugCheckInvariants();
}